

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::VertexContainer::~VertexContainer(VertexContainer *this)

{
  aiVector3D **texcoords;
  aiVector3D **__end2;
  aiVector3D **__begin2;
  aiVector3D *(*__range2) [8];
  VertexContainer *this_local;
  
  if (this->m_colors != (aiColor4D *)0x0) {
    operator_delete__(this->m_colors);
  }
  for (__end2 = this->m_textureCoords; (VertexContainer *)__end2 != this + 1; __end2 = __end2 + 1) {
    if (*__end2 != (aiVector3D *)0x0) {
      operator_delete__(*__end2);
    }
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_normals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_vertices);
  return;
}

Assistant:

OpenGEXImporter::VertexContainer::~VertexContainer() {
    delete[] m_colors;

    for(auto &texcoords : m_textureCoords) {
        delete [] texcoords;
    }
}